

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

void MIR_change_module_ctx(MIR_context_t old_ctx,MIR_module_t_conflict m,MIR_context_t new_ctx)

{
  MIR_module_t pMVar1;
  MIR_module_t pMVar2;
  MIR_context_t item;
  long *plVar3;
  ulong uVar4;
  int iVar5;
  MIR_alias_t MVar6;
  char *pcVar7;
  MIR_context_t string;
  ulong *puVar8;
  char *pcVar9;
  DLIST_LINK_MIR_module_t *pDVar10;
  ulong uVar11;
  MIR_context_t ctx;
  undefined8 *puVar12;
  long lVar13;
  MIR_alias_t *pMVar14;
  MIR_str_t str;
  MIR_item_t_conflict tab_item;
  MIR_item item_s;
  MIR_item_t_conflict tab_item_1;
  MIR_context_t local_120 [2];
  undefined8 local_110;
  undefined8 uStack_108;
  MIR_item local_100;
  MIR_context_t local_b8 [17];
  
  if (m == (MIR_module_t_conflict)0x0) {
    MIR_change_module_ctx_cold_5();
LAB_0013926b:
    MIR_change_module_ctx_cold_1();
LAB_00139270:
    MIR_change_module_ctx_cold_2();
    if (old_ctx == (MIR_context_t)0x0) {
      __assert_fail("item != ((void*)0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                    ,0xae5,"void set_item_name(MIR_item_t, const char *)");
    }
    switch(*(undefined4 *)&old_ctx->insn_nops) {
    case 0:
    case 1:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
      old_ctx->used_label_p->els_num = (size_t)m;
      break;
    case 2:
    case 3:
    case 4:
      old_ctx->used_label_p = (VARR_uint8_t *)m;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                    ,0xaf1,"void set_item_name(MIR_item_t, const char *)");
    }
    return;
  }
  pMVar1 = (m->module_link).prev;
  if (pMVar1 == (MIR_module_t)0x0) {
    if ((old_ctx->all_modules).head != m) goto LAB_0013926b;
    (old_ctx->all_modules).head = (m->module_link).next;
  }
  else {
    (pMVar1->module_link).next = (m->module_link).next;
  }
  pMVar2 = (m->module_link).next;
  if (pMVar2 == (MIR_module_t)0x0) {
    if ((old_ctx->all_modules).tail != m) goto LAB_00139270;
    pDVar10 = (DLIST_LINK_MIR_module_t *)&(old_ctx->all_modules).tail;
  }
  else {
    pDVar10 = &pMVar2->module_link;
  }
  pDVar10->prev = pMVar1;
  (m->module_link).prev = (MIR_module_t)0x0;
  (m->module_link).next = (MIR_module_t)0x0;
  DLIST_MIR_module_t_append(&new_ctx->all_modules,m);
  ctx = new_ctx;
  pcVar7 = get_ctx_str(new_ctx,m->name);
  m->name = pcVar7;
  item = (MIR_context_t)(m->items).head;
  while( true ) {
    if (item == (MIR_context_t)0x0) {
      if (new_ctx->curr_label_num < old_ctx->curr_label_num) {
        new_ctx->curr_label_num = old_ctx->curr_label_num;
      }
      return;
    }
    if (item->temp_string != (VARR_char *)0x0) break;
    string = (MIR_context_t)MIR_item_name(ctx,(MIR_item_t_conflict)item);
    if (string != (MIR_context_t)0x0) {
      pcVar7 = get_ctx_str(new_ctx,(char *)string);
      local_100.item_type = MIR_func_item;
      local_100.u.func = (MIR_func_t)local_b8;
      local_100.module = m;
      local_b8[0] = string;
      iVar5 = HTAB_MIR_item_t_do(old_ctx->module_item_tab,&local_100,HTAB_FIND,
                                 (MIR_item_t_conflict *)local_120);
      if ((iVar5 == 0) || (local_120[0] != item)) {
        ctx = item;
        set_item_name((MIR_item_t_conflict)item,pcVar7);
      }
      else {
        local_b8[0] = item;
        HTAB_MIR_item_t_do(old_ctx->module_item_tab,(MIR_item_t_conflict)item,HTAB_DELETE,
                           (MIR_item_t_conflict *)local_b8);
        set_item_name((MIR_item_t_conflict)item,pcVar7);
        ctx = (MIR_context_t)new_ctx->module_item_tab;
        HTAB_MIR_item_t_do((HTAB_MIR_item_t *)ctx,(MIR_item_t_conflict)item,HTAB_INSERT,
                           (MIR_item_t_conflict *)local_b8);
        if (item != local_b8[0]) goto LAB_00139247;
      }
    }
    if (*(MIR_item_type_t *)&item->insn_nops == MIR_func_item) {
      plVar3 = (long *)((anon_union_8_10_166bea1d_for_u *)&item->used_label_p)->expr_data[5].name;
      if (*plVar3 == 0) goto LAB_00139242;
      puVar8 = (ulong *)*plVar3;
      if (puVar8 == (ulong *)0x0) {
LAB_0013922c:
        MIR_change_module_ctx_cold_3();
        break;
      }
      puVar12 = (undefined8 *)(*(long *)(*plVar3 + 0x10) + 0x28);
      uVar11 = 0;
      while (uVar11 = uVar11 + 1, uVar11 < *puVar8) {
        pcVar7 = get_ctx_str(new_ctx,(char *)puVar12[-1]);
        puVar12[-1] = pcVar7;
        if ((char *)*puVar12 != (char *)0x0) {
          pcVar7 = get_ctx_str(new_ctx,(char *)*puVar12);
          *puVar12 = pcVar7;
        }
        puVar12 = puVar12 + 3;
        puVar8 = (ulong *)*plVar3;
        if (puVar8 == (ulong *)0x0) goto LAB_0013922c;
      }
      ctx = new_ctx;
      change_var_names(new_ctx,(VARR_MIR_var_t *)
                               ((anon_union_8_10_166bea1d_for_u *)&item->used_label_p)->expr_data[3]
                               .load_addr);
      puVar8 = (ulong *)((anon_union_8_10_166bea1d_for_u *)&item->used_label_p)->expr_data[4].name;
      if ((puVar8 != (ulong *)0x0) && (*puVar8 != 0)) {
        lVar13 = 8;
        uVar11 = 0;
        do {
          uVar4 = puVar8[2];
          ctx = new_ctx;
          pcVar7 = get_ctx_str(new_ctx,*(char **)(uVar4 + lVar13));
          *(char **)(uVar4 + lVar13) = pcVar7;
          uVar11 = uVar11 + 1;
          lVar13 = lVar13 + 0x18;
        } while (uVar11 < *puVar8);
      }
      for (pcVar7 = ((anon_union_8_10_166bea1d_for_u *)&item->used_label_p)->expr_data[1].name;
          pcVar7 != (char *)0x0; pcVar7 = *(char **)(pcVar7 + 0x10)) {
        if (*(int *)(pcVar7 + 0x1c) != 0) {
          pMVar14 = (MIR_alias_t *)(pcVar7 + 0x38);
          uVar11 = 0;
          do {
            if ((char)pMVar14[-4] == '\n') {
              if (pMVar14[-1] != 0) {
                pcVar9 = MIR_alias_name(old_ctx,pMVar14[-1]);
                ctx = new_ctx;
                MVar6 = MIR_alias(new_ctx,pcVar9);
                pMVar14[-1] = MVar6;
              }
              if (*pMVar14 != 0) {
                pcVar9 = MIR_alias_name(old_ctx,*pMVar14);
                ctx = new_ctx;
                MVar6 = MIR_alias(new_ctx,pcVar9);
                *pMVar14 = MVar6;
              }
            }
            else if ((char)pMVar14[-4] == '\t') {
              ctx = (MIR_context_t)(local_120 + 1);
              str.s = *(char **)pMVar14;
              str.len = *(size_t *)(pMVar14 + -2);
              string_store((string_t *)ctx,new_ctx,&new_ctx->string_ctx->strings,
                           &new_ctx->string_ctx->string_tab,str);
              *(undefined8 *)(pMVar14 + -2) = local_110;
              *(undefined8 *)pMVar14 = uStack_108;
            }
            uVar11 = uVar11 + 1;
            pMVar14 = pMVar14 + 0xc;
          } while (uVar11 < *(uint *)(pcVar7 + 0x1c));
        }
      }
    }
    else if (*(MIR_item_type_t *)&item->insn_nops == MIR_proto_item) {
      ctx = new_ctx;
      change_var_names(new_ctx,(VARR_MIR_var_t *)
                               ((anon_union_8_10_166bea1d_for_u *)&item->used_label_p)->expr_data[1]
                               .expr_item);
    }
    item = *(MIR_context_t *)&item->func_redef_permission_p;
  }
  (*old_ctx->error_func)(MIR_ctx_change_error,"Change context of a loaded module");
LAB_00139242:
  MIR_change_module_ctx_cold_4();
LAB_00139247:
  __assert_fail("item == tab_item",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                ,0xb11,"void MIR_change_module_ctx(MIR_context_t, MIR_module_t, MIR_context_t)");
}

Assistant:

void MIR_change_module_ctx (MIR_context_t old_ctx, MIR_module_t m, MIR_context_t new_ctx) {
  MIR_item_t item, tab_item;
  MIR_op_mode_t mode;
  const char *name, *new_name;

  DLIST_REMOVE (MIR_module_t, *MIR_get_module_list (old_ctx), m);
  DLIST_APPEND (MIR_module_t, *MIR_get_module_list (new_ctx), m);
  m->name = get_ctx_str (new_ctx, m->name);
  for (item = DLIST_HEAD (MIR_item_t, m->items); item != NULL;
       item = DLIST_NEXT (MIR_item_t, item)) {
    if (item->addr != NULL)
      MIR_get_error_func (old_ctx) (MIR_ctx_change_error, "Change context of a loaded module");
    if ((name = MIR_item_name (old_ctx, item)) != NULL) {
      new_name = get_ctx_str (new_ctx, name);
      if (item_tab_find (old_ctx, name, m) != item) {
        set_item_name (item, new_name);
      } else {
        item_tab_remove (old_ctx, item);
        set_item_name (item, new_name);
        tab_item = item_tab_insert (new_ctx, item);
        mir_assert (item == tab_item);
      }
    }
    if (item->item_type == MIR_proto_item) {
      change_var_names (new_ctx, item->u.proto->args);
    } else if (item->item_type == MIR_func_item) {
      func_regs_t func_regs = item->u.func->internal;
      reg_desc_t *rds = VARR_ADDR (reg_desc_t, func_regs->reg_descs);

      for (size_t i = 1; i < VARR_LENGTH (reg_desc_t, func_regs->reg_descs); i++) {
        rds[i].name = (char *) get_ctx_str (new_ctx, rds[i].name);
        if (rds[i].hard_reg_name != NULL)
          rds[i].hard_reg_name = (char *) get_ctx_str (new_ctx, rds[i].hard_reg_name);
      }
      change_var_names (new_ctx, item->u.func->vars);
      if (item->u.func->global_vars != NULL) change_var_names (new_ctx, item->u.func->global_vars);

      for (MIR_insn_t insn = DLIST_HEAD (MIR_insn_t, item->u.func->insns); insn != NULL;
           insn = DLIST_NEXT (MIR_insn_t, insn)) {
        for (size_t i = 0; i < insn->nops; i++) {
          if ((mode = insn->ops[i].mode) == MIR_OP_STR) {
            insn->ops[i].u.str = get_ctx_string (new_ctx, insn->ops[i].u.str).str;
          } else if (mode == MIR_OP_MEM) {
            if (insn->ops[i].u.mem.alias != 0)
              insn->ops[i].u.mem.alias
                = MIR_alias (new_ctx, MIR_alias_name (old_ctx, insn->ops[i].u.mem.alias));
            if (insn->ops[i].u.mem.nonalias != 0)
              insn->ops[i].u.mem.nonalias
                = MIR_alias (new_ctx, MIR_alias_name (old_ctx, insn->ops[i].u.mem.nonalias));
          }
        }
      }
    }
  }
#undef curr_label_num
  if (new_ctx->curr_label_num < old_ctx->curr_label_num)
    new_ctx->curr_label_num = old_ctx->curr_label_num;
#define curr_label_num ctx->curr_label_num
}